

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode do_init(connectdata *conn)

{
  SessionHandle *data_00;
  timeval tVar1;
  __time_t local_30;
  __suseconds_t local_28;
  SingleRequest *k;
  SessionHandle *data;
  connectdata *conn_local;
  
  data_00 = conn->data;
  (conn->bits).done = false;
  (conn->bits).do_more = false;
  (data_00->state).expect100header = false;
  if (((data_00->set).opt_no_body & 1U) == 0) {
    if ((data_00->set).httpreq == HTTPREQ_HEAD) {
      (data_00->set).httpreq = HTTPREQ_GET;
    }
  }
  else {
    (data_00->set).httpreq = HTTPREQ_HEAD;
  }
  tVar1 = curlx_tvnow();
  local_30 = tVar1.tv_sec;
  (data_00->req).start.tv_sec = local_30;
  local_28 = tVar1.tv_usec;
  (data_00->req).start.tv_usec = local_28;
  (data_00->req).now.tv_sec = (data_00->req).start.tv_sec;
  (data_00->req).now.tv_usec = (data_00->req).start.tv_usec;
  (data_00->req).header = true;
  (data_00->req).bytecount = 0;
  (data_00->req).buf = (data_00->state).buffer;
  (data_00->req).uploadbuf = (data_00->state).uploadbuffer;
  (data_00->req).hbufp = (data_00->state).headerbuff;
  (data_00->req).ignorebody = false;
  Curl_speedinit(data_00);
  Curl_pgrsSetUploadCounter(data_00,0);
  Curl_pgrsSetDownloadCounter(data_00,0);
  return CURLE_OK;
}

Assistant:

static CURLcode do_init(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;
  struct SingleRequest *k = &data->req;

  conn->bits.done = FALSE; /* Curl_done() is not called yet */
  conn->bits.do_more = FALSE; /* by default there's no curl_do_more() to use */
  data->state.expect100header = FALSE;

  if(data->set.opt_no_body)
    /* in HTTP lingo, no body means using the HEAD request... */
    data->set.httpreq = HTTPREQ_HEAD;
  else if(HTTPREQ_HEAD == data->set.httpreq)
    /* ... but if unset there really is no perfect method that is the
       "opposite" of HEAD but in reality most people probably think GET
       then. The important thing is that we can't let it remain HEAD if the
       opt_no_body is set FALSE since then we'll behave wrong when getting
       HTTP. */
    data->set.httpreq = HTTPREQ_GET;

  k->start = Curl_tvnow(); /* start time */
  k->now = k->start;   /* current time is now */
  k->header = TRUE; /* assume header */

  k->bytecount = 0;

  k->buf = data->state.buffer;
  k->uploadbuf = data->state.uploadbuffer;
  k->hbufp = data->state.headerbuff;
  k->ignorebody=FALSE;

  Curl_speedinit(data);

  Curl_pgrsSetUploadCounter(data, 0);
  Curl_pgrsSetDownloadCounter(data, 0);

  return CURLE_OK;
}